

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::isRenderableFormat(GLenum internalFormat)

{
  bool bVar1;
  undefined1 local_d;
  GLenum internalFormat_local;
  
  bVar1 = isColorRenderableFormat(internalFormat);
  local_d = true;
  if ((((!bVar1) && (local_d = true, internalFormat != 0x81a5)) &&
      (local_d = true, internalFormat != 0x81a6)) &&
     ((local_d = true, internalFormat != 0x8cac && (local_d = true, internalFormat != 0x88f0)))) {
    local_d = internalFormat == 0x8cad;
  }
  return local_d;
}

Assistant:

static bool isRenderableFormat (glw::GLenum internalFormat)
{
	return	isColorRenderableFormat(internalFormat)	||
			internalFormat == GL_DEPTH_COMPONENT16	||
			internalFormat == GL_DEPTH_COMPONENT24	||
			internalFormat == GL_DEPTH_COMPONENT32F	||
			internalFormat == GL_DEPTH24_STENCIL8	||
			internalFormat == GL_DEPTH32F_STENCIL8;
}